

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::ComputeWeightsLocal
          (TPZDohrSubstructCondense<double> *this,TPZFMatrix<double> *StiffnessDiagLocal)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  TPZVec<int> *pTVar6;
  double *pdVar7;
  ulong col;
  ulong uVar8;
  ulong uVar9;
  ulong row;
  
  uVar9 = 0;
  pTVar6 = ScatterVec(this,ExternalFirst,Submesh);
  uVar3 = this->fNumExternalEquations;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    dVar1 = (this->fWeights).super_TPZVec<double>.fStore[pTVar6->fStore[uVar9]];
    pdVar7 = TPZFMatrix<double>::operator()(StiffnessDiagLocal,uVar9,0);
    (this->fWeights).super_TPZVec<double>.fStore[pTVar6->fStore[uVar9]] = dVar1 / *pdVar7;
  }
  iVar5 = this->fNEquations;
  piVar4 = pTVar6->fStore;
  pdVar7 = (this->fWeights).super_TPZVec<double>.fStore;
  for (uVar9 = uVar8; (long)uVar9 < (long)iVar5; uVar9 = uVar9 + 1) {
    pdVar7[piVar4[uVar9]] = 1.0;
  }
  row = 0;
  pTVar6 = GatherVec(this,Submesh,ExternalFirst);
  uVar9 = (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  iVar5 = (int)uVar9;
  TPZFMatrix<double>::Resize(&this->fPhiC_Weighted_Condensed,(long)(int)uVar3,(long)iVar5);
  uVar9 = uVar9 & 0xffffffff;
  if (iVar5 < 1) {
    uVar9 = row;
  }
  for (; row != uVar8; row = row + 1) {
    for (col = 0; uVar9 != col; col = col + 1) {
      pdVar7 = TPZFMatrix<double>::operator()(&this->fPhiC,(long)pTVar6->fStore[row],col);
      dVar1 = *pdVar7;
      dVar2 = (this->fWeights).super_TPZVec<double>.fStore[pTVar6->fStore[row]];
      pdVar7 = TPZFMatrix<double>::operator()(&this->fPhiC_Weighted_Condensed,row,col);
      *pdVar7 = dVar1 * dVar2;
    }
  }
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	//fWeights.Fill(1.);
	TPZVec<int> &scatter = ScatterVec(ExternalFirst, Submesh);
	int neqs = fNumExternalEquations;
	for (i=0;i<neqs;i++) {
		fWeights[scatter[i]] = fWeights[scatter[i]] / StiffnessDiagLocal(i,0);
	}
	for(; i<fNEquations; i++)
	{
		fWeights[scatter[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	TPZVec<int> &gather = GatherVec(Submesh, ExternalFirst);
	int c,nc = fPhiC.Cols();
	fPhiC_Weighted_Condensed.Resize(neqs,nc);
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			fPhiC_Weighted_Condensed(i,c) = fPhiC(gather[i],c)*fWeights[gather[i]];
		}
	}
}